

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

boolean equip_is_worn(obj *otmp)

{
  boolean bVar1;
  byte local_12;
  bool local_11;
  boolean worn;
  obj *otmp_local;
  
  local_11 = otmp == uarmu || otmp == uarm;
  if (otmp == uarmc) {
    local_11 = true;
  }
  if (otmp == uarmf) {
    local_11 = true;
  }
  if (otmp == uarmh) {
    local_11 = true;
  }
  if (otmp == uarmg) {
    local_11 = true;
  }
  if (otmp == uarms) {
    local_11 = true;
  }
  if (otmp == uamul) {
    local_11 = true;
  }
  if (otmp == uleft) {
    local_11 = true;
  }
  if (otmp == uright) {
    local_11 = true;
  }
  local_12 = 0;
  if (local_11) {
    bVar1 = donning_on(otmp);
    local_12 = bVar1 != '\0' ^ 0xff;
  }
  return local_12 & 1;
}

Assistant:

boolean equip_is_worn(const struct obj *otmp)
{
	boolean worn = FALSE;

	if (otmp == uarm) worn = TRUE;
	if (otmp == uarmu) worn = TRUE;
	if (otmp == uarmc) worn = TRUE;
	if (otmp == uarmf) worn = TRUE;
	if (otmp == uarmh) worn = TRUE;
	if (otmp == uarmg) worn = TRUE;
	if (otmp == uarms) worn = TRUE;

	if (otmp == uamul) worn = TRUE;
	if (otmp == uleft) worn = TRUE;
	if (otmp == uright) worn = TRUE;

	/*
	 * Beware: Gives a false positive between cancel_don() and Foo_off().
	 * See caveat in donning_on() for details.
	 */
	return !!(worn && !donning_on(otmp));
}